

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O2

void SS_mangle(uchar *key,uchar *ret_key,int nbytes)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uchar *puVar6;
  byte *pbVar7;
  ulong uVar8;
  uchar *puVar9;
  
  uVar3 = nbytes % 4;
  uVar1 = ~(nbytes / 4 >> 0x1f) & nbytes / 4;
  pbVar2 = key + 3;
  puVar6 = ret_key;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    uVar8 = 0;
    pbVar7 = pbVar2;
    for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 8) {
      uVar8 = uVar8 | (ulong)*pbVar7 << (uVar4 & 0x3f);
      pbVar7 = pbVar7 + -1;
    }
    puVar9 = puVar6;
    for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 8) {
      *puVar9 = (uchar)(uVar8 * 0x7c32b16d >> (uVar4 & 0x3f));
      puVar9 = puVar9 + 1;
    }
    pbVar2 = pbVar2 + 4;
    puVar6 = puVar6 + 4;
  }
  pbVar2 = key + (int)(uVar3 + uVar1 * 4);
  uVar5 = (ulong)(~((int)uVar3 >> 0x1f) & uVar3) << 3;
  uVar8 = 0;
  for (uVar4 = 0; pbVar2 = pbVar2 + -1, uVar5 != uVar4; uVar4 = uVar4 + 8) {
    uVar8 = uVar8 | (ulong)*pbVar2 << (uVar4 & 0x3f);
  }
  puVar6 = ret_key + (uVar1 << 2);
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 8) {
    *puVar6 = (uchar)(uVar8 * 0x7c32b16d >> (uVar4 & 0x3f));
    puVar6 = puVar6 + 1;
  }
  return;
}

Assistant:

void SS_mangle(const unsigned char* key, unsigned char* ret_key,
	int nbytes) {
	int i, j;
	unsigned long long new_key;
	for (j = 0; j < nbytes / 4; ++j) {
		new_key = 0;
		for (i = 0; i < 4; ++i) {
			uint64_t tmp = 0;
			tmp = key[4 - i - 1 + j * 4];
			new_key |= tmp << (i * 8);
		}
		new_key = (new_key * 2083697005) & (0xffffffffffffffff);
		for (i = 0; i < 4; ++i) {
			ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
		}
	}

	int remain = nbytes % 4;
	new_key = 0;
	for (i = 0; i < remain; ++i) {
		uint64_t tmp = 0;
		tmp = key[remain - i - 1 + j * 4];
		new_key |= tmp << (i * 8);
	}
	new_key = (new_key * 2083697005) & (0xffffffffffffffff);
	for (i = 0; i < remain; ++i) {
		ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
	}
}